

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int numusearray(Table *t,int *nums)

{
  int local_30;
  int local_2c;
  int lim;
  int lc;
  int i;
  int ause;
  int ttlg;
  int lg;
  int *nums_local;
  Table *t_local;
  
  lc = 0;
  lim = 1;
  ause = 0;
  i = 1;
  while( true ) {
    if (0x1e < ause) {
      return lc;
    }
    local_2c = 0;
    local_30 = i;
    if ((t->sizearray < i) && (local_30 = t->sizearray, local_30 < lim)) break;
    for (; lim <= local_30; lim = lim + 1) {
      if (t->array[lim + -1].tt != 0) {
        local_2c = local_2c + 1;
      }
    }
    nums[ause] = local_2c + nums[ause];
    lc = local_2c + lc;
    ause = ause + 1;
    i = i << 1;
  }
  return lc;
}

Assistant:

static int numusearray(const Table*t,int*nums){
int lg;
int ttlg;
int ause=0;
int i=1;
for(lg=0,ttlg=1;lg<=(32-2);lg++,ttlg*=2){
int lc=0;
int lim=ttlg;
if(lim>t->sizearray){
lim=t->sizearray;
if(i>lim)
break;
}
for(;i<=lim;i++){
if(!ttisnil(&t->array[i-1]))
lc++;
}
nums[lg]+=lc;
ause+=lc;
}
return ause;
}